

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

string * testing::internal::StreamableToString<int>(string *__return_storage_ptr__,int *streamable)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::operator<<((ostream *)(local_20._M_head_impl + 0x10),*streamable);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}